

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

qsizetype __thiscall
QCborStreamReaderPrivate::readStringChunk_utf8
          (QCborStreamReaderPrivate *this,ReadStringChunk params,qsizetype utf8len)

{
  bool bVar1;
  qsizetype qVar2;
  QByteArrayView s;
  
  qVar2 = readStringChunk_byte(this,params,utf8len);
  if (-1 < qVar2) {
    s.m_data = ((params.field_0.array)->d).ptr + (((params.field_0.array)->d).size - qVar2);
    s.m_size = qVar2;
    bVar1 = QtPrivate::isValidUtf8(s);
    if (!bVar1) {
      this->corrupt = true;
      (this->lastError).c = InvalidUtf8String;
      qVar2 = -1;
    }
  }
  return qVar2;
}

Assistant:

inline qsizetype
QCborStreamReaderPrivate::readStringChunk_utf8(ReadStringChunk params, qsizetype utf8len)
{
    qsizetype result = readStringChunk_byte(params, utf8len);
    if (result < 0)
        return result;

    // validate the UTF-8 content we've just read
    QByteArrayView chunk = *params.array;
    chunk = chunk.last(result);
    if (QtPrivate::isValidUtf8(chunk))
        return result;

    handleError(CborErrorInvalidUtf8TextString);
    return -1;
}